

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

MergeEngine * vdbeMergeEngineNew(int nReader)

{
  int iVar1;
  MergeEngine *local_28;
  MergeEngine *pNew;
  int local_10;
  int nByte;
  int N;
  int nReader_local;
  
  for (local_10 = 2; local_10 < nReader; local_10 = local_10 * 2) {
  }
  iVar1 = sqlite3FaultSim(100);
  if (iVar1 == 0) {
    local_28 = (MergeEngine *)sqlite3MallocZero((long)(local_10 * 0x54 + 0x20));
  }
  else {
    local_28 = (MergeEngine *)0x0;
  }
  if (local_28 != (MergeEngine *)0x0) {
    local_28->nTree = local_10;
    local_28->pTask = (SortSubtask *)0x0;
    local_28->aReadr = (PmaReader *)(local_28 + 1);
    local_28->aTree = (int *)(local_28->aReadr + local_10);
  }
  return local_28;
}

Assistant:

static MergeEngine *vdbeMergeEngineNew(int nReader){
  int N = 2;                      /* Smallest power of two >= nReader */
  int nByte;                      /* Total bytes of space to allocate */
  MergeEngine *pNew;              /* Pointer to allocated object to return */

  assert( nReader<=SORTER_MAX_MERGE_COUNT );

  while( N<nReader ) N += N;
  nByte = sizeof(MergeEngine) + N * (sizeof(int) + sizeof(PmaReader));

  pNew = sqlite3FaultSim(100) ? 0 : (MergeEngine*)sqlite3MallocZero(nByte);
  if( pNew ){
    pNew->nTree = N;
    pNew->pTask = 0;
    pNew->aReadr = (PmaReader*)&pNew[1];
    pNew->aTree = (int*)&pNew->aReadr[N];
  }
  return pNew;
}